

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O3

void mutexTestThr2(void *arg)

{
  int iVar1;
  int iVar2;
  
  deMutex_lock(*arg);
  iVar2 = *(int *)((long)arg + 8);
  iVar1 = 0;
  if (iVar2 < *(int *)((long)arg + 0x10)) {
    iVar1 = 0;
    do {
      deYield();
      if (iVar2 != *(int *)((long)arg + 8)) {
        deAssertFail("localCounter == data->counter",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                     ,0xd1);
      }
      *(int *)((long)arg + 8) = iVar2 + 1;
      deMutex_unlock(*arg);
      iVar1 = iVar1 + 1;
      deMutex_lock(*arg);
      iVar2 = *(int *)((long)arg + 8);
    } while (iVar2 < *(int *)((long)arg + 0x10));
  }
  deMutex_unlock(*arg);
  deMutex_lock(*arg);
  *(int *)((long)arg + 0xc) = *(int *)((long)arg + 0xc) + iVar1;
  deMutex_unlock(*arg);
  return;
}

Assistant:

static void mutexTestThr2 (void* arg)
{
	MutexData2* data = (MutexData2*)arg;
	deInt32 numIncremented = 0;

	for (;;)
	{
		deInt32 localCounter;
		deMutex_lock(data->mutex);

		if (data->counter >= data->maxVal)
		{
			deMutex_unlock(data->mutex);
			break;
		}

		localCounter = data->counter;
		deYield();

		DE_TEST_ASSERT(localCounter == data->counter);
		localCounter += 1;
		data->counter = localCounter;

		deMutex_unlock(data->mutex);

		numIncremented++;
	}

	deMutex_lock(data->mutex);
	data->counter2 += numIncremented;
	deMutex_unlock(data->mutex);
}